

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall
mkvparser::Cluster::CreateBlock
          (Cluster *this,longlong id,longlong pos,longlong size,longlong discard_padding)

{
  ulong uVar1;
  BlockEntry **ppBVar2;
  long lVar3;
  BlockEntry **ppBVar4;
  long lVar5;
  
  if ((id == 0xa3) || (id == 0xa0)) {
    ppBVar4 = this->m_entries;
    lVar5 = this->m_entries_count;
    if (lVar5 < 0) {
      if (ppBVar4 != (BlockEntry **)0x0) {
        __assert_fail("m_entries == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1be6,
                      "long mkvparser::Cluster::CreateBlock(long long, long long, long long, long long)"
                     );
      }
      if (this->m_entries_size != 0) {
        __assert_fail("m_entries_size == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1be7,
                      "long mkvparser::Cluster::CreateBlock(long long, long long, long long, long long)"
                     );
      }
      this->m_entries_size = 0x400;
      ppBVar4 = (BlockEntry **)operator_new__(0x2000,(nothrow_t *)&std::nothrow);
      this->m_entries = ppBVar4;
      if (ppBVar4 != (BlockEntry **)0x0) {
        this->m_entries_count = 0;
        goto LAB_0012e051;
      }
    }
    else {
      if (ppBVar4 == (BlockEntry **)0x0) {
        __assert_fail("m_entries",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1bf0,
                      "long mkvparser::Cluster::CreateBlock(long long, long long, long long, long long)"
                     );
      }
      uVar1 = this->m_entries_size;
      if ((long)uVar1 < 1) {
        __assert_fail("m_entries_size > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1bf1,
                      "long mkvparser::Cluster::CreateBlock(long long, long long, long long, long long)"
                     );
      }
      if ((long)uVar1 < lVar5) {
        __assert_fail("m_entries_count <= m_entries_size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1bf2,
                      "long mkvparser::Cluster::CreateBlock(long long, long long, long long, long long)"
                     );
      }
      if (lVar5 < (long)uVar1) {
LAB_0012e051:
        if (id != 0xa0) {
          lVar5 = CreateSimpleBlock(this,pos,size);
          return lVar5;
        }
        lVar5 = CreateBlockGroup(this,pos,size,discard_padding);
        return lVar5;
      }
      ppBVar2 = (BlockEntry **)
                operator_new__(-(ulong)(uVar1 >> 0x3c != 0) | uVar1 << 4,(nothrow_t *)&std::nothrow)
      ;
      if (ppBVar2 != (BlockEntry **)0x0) {
        if (lVar5 != 0) {
          lVar3 = 0;
          do {
            *(undefined8 *)((long)ppBVar2 + lVar3) = *(undefined8 *)((long)ppBVar4 + lVar3);
            lVar3 = lVar3 + 8;
          } while (lVar5 << 3 != lVar3);
        }
        operator_delete__(ppBVar4);
        this->m_entries = ppBVar2;
        this->m_entries_size = uVar1 * 2;
        if (ppBVar2 != (BlockEntry **)0x0) goto LAB_0012e051;
      }
    }
  }
  return -1;
}

Assistant:

long Cluster::CreateBlock(long long id,
                          long long pos,  // absolute pos of payload
                          long long size, long long discard_padding) {
  if (id != libwebm::kMkvBlockGroup && id != libwebm::kMkvSimpleBlock)
    return E_PARSE_FAILED;

  if (m_entries_count < 0) {  // haven't parsed anything yet
    assert(m_entries == NULL);
    assert(m_entries_size == 0);

    m_entries_size = 1024;
    m_entries = new (std::nothrow) BlockEntry*[m_entries_size];
    if (m_entries == NULL)
      return -1;

    m_entries_count = 0;
  } else {
    assert(m_entries);
    assert(m_entries_size > 0);
    assert(m_entries_count <= m_entries_size);

    if (m_entries_count >= m_entries_size) {
      const long entries_size = 2 * m_entries_size;

      BlockEntry** const entries = new (std::nothrow) BlockEntry*[entries_size];
      if (entries == NULL)
        return -1;

      BlockEntry** src = m_entries;
      BlockEntry** const src_end = src + m_entries_count;

      BlockEntry** dst = entries;

      while (src != src_end)
        *dst++ = *src++;

      delete[] m_entries;

      m_entries = entries;
      m_entries_size = entries_size;
    }
  }

  if (id == libwebm::kMkvBlockGroup)
    return CreateBlockGroup(pos, size, discard_padding);
  else
    return CreateSimpleBlock(pos, size);
}